

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ManCountPosWithNonZeroDrivers(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_20;
  int local_1c;
  int Count;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar2 = false;
    if (local_1c < iVar1) {
      _Count = Gia_ManCo(p,local_1c);
      bVar2 = _Count != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjId(p,_Count);
    iVar1 = Gia_ObjFaninLit0(_Count,iVar1);
    local_20 = (uint)(iVar1 != 0) + local_20;
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Gia_ManCountPosWithNonZeroDrivers( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int i, Count = 0;
    Gia_ManForEachCo( p, pObj, i )
        Count += Gia_ObjFaninLit0(pObj, Gia_ObjId(p, pObj)) != 0;
    return Count;
}